

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayoutengine_p.h
# Opt level: O0

int __thiscall
QGraphicsGridLayoutEngine::indexOf(QGraphicsGridLayoutEngine *this,QGraphicsLayoutItem *item)

{
  QList<QGridLayoutItem_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  QGraphicsLayoutItem *pQVar3;
  QGraphicsLayoutItem *in_RSI;
  QList<QGridLayoutItem_*> *in_RDI;
  int i;
  QGraphicsLayoutItem *pQVar4;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    this_00 = (QList<QGridLayoutItem_*> *)(long)local_1c;
    qVar1 = QList<QGridLayoutItem_*>::size(in_RDI);
    if (qVar1 <= (long)this_00) {
      return -1;
    }
    pQVar4 = in_RSI;
    ppQVar2 = QList<QGridLayoutItem_*>::at(this_00,(qsizetype)in_RSI);
    pQVar3 = QGraphicsGridLayoutEngineItem::layoutItem((QGraphicsGridLayoutEngineItem *)*ppQVar2);
    if (pQVar4 == pQVar3) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int indexOf(QGraphicsLayoutItem *item) const
    {
        for (int i = 0; i < q_items.size(); ++i) {
            if (item == static_cast<QGraphicsGridLayoutEngineItem*>(q_items.at(i))->layoutItem())
                return i;
        }
        return -1;
    }